

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void Search::del_features_in_top_namespace(search_private *param_1,example *ec,size_t ns)

{
  uchar *puVar1;
  features *this;
  
  puVar1 = (ec->super_example_predict).indices._end;
  if ((puVar1 != (ec->super_example_predict).indices._begin) && (puVar1[-1] == ns)) {
    this = (ec->super_example_predict).feature_space + ns;
    (ec->super_example_predict).indices._end = puVar1 + -1;
    ec->num_features =
         ec->num_features -
         ((long)(ec->super_example_predict).feature_space[ns].values._end -
          (long)(this->values)._begin >> 2);
    ec->total_sum_feat_sq =
         ec->total_sum_feat_sq - (ec->super_example_predict).feature_space[ns].sum_feat_sq;
    features::clear(this);
    return;
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }